

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

void delay_timer_cb(uv_timer_t *timer)

{
  int *piVar1;
  int iVar2;
  uint pevents;
  uv_poll_t *handle;
  undefined8 *__ptr;
  
  handle = (uv_poll_t *)timer->data;
  iVar2 = uv_is_active((uv_handle_t *)timer);
  if (iVar2 == 0) {
    if (*(uint *)(handle[2].handle_queue + 1) == 0) goto LAB_001658e3;
    pevents = *(uint *)(handle[2].handle_queue + 1) | *(uint *)((long)handle[2].handle_queue + 4);
    *(uint *)((long)handle[2].handle_queue + 4) = pevents;
    *(undefined4 *)(handle[2].handle_queue + 1) = 0;
    iVar2 = uv_poll_start(handle,pevents,connection_poll_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001658e3:
    handle = (uv_poll_t *)timer;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)handle->data;
  piVar1 = (int *)((long)__ptr + 0x154);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
      goto LAB_0016595f;
    }
  }
  else if (__ptr[0x28] != 0x10000) {
LAB_0016595f:
    connection_close_cb_cold_1();
    goto LAB_00165964;
  }
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00165944;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_00165964:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return;
  }
LAB_00165944:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return;
}

Assistant:

static void delay_timer_cb(uv_timer_t* timer) {
  connection_context_t* context = (connection_context_t*) timer->data;
  int r;

  /* Timer should auto stop. */
  ASSERT(0 == uv_is_active((uv_handle_t*) timer));

  /* Add the requested events to the poll mask. */
  ASSERT(context->delayed_events != 0);
  context->events |= context->delayed_events;
  context->delayed_events = 0;

  r = uv_poll_start(&context->poll_handle,
                    context->events,
                    connection_poll_cb);
  ASSERT(r == 0);
}